

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_dead_code.hpp
# Opt level: O1

bool __thiscall
optimization::remove_dead_code::Remove_Dead_Code::remove_dead_code
          (Remove_Dead_Code *this,shared_ptr<optimization::livevar_analyse::Block_Live_Var> *blv,
          BasicBlk *block,
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          *vartable)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  long lVar3;
  sharedPtrVariableSet *psVar4;
  element_type *peVar5;
  int iVar6;
  mapped_type *pmVar7;
  _Rb_tree_header *p_Var8;
  iterator __position;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  sharedPtrVariableSet *psVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar12;
  bool bVar13;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *this_01;
  bool bVar14;
  sharedPtrVariableSet tmp;
  VarId defvar;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  int local_44;
  undefined **local_40;
  uint32_t local_38 [2];
  
  local_50._M_pi =
       (((blv->
         super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr)->live_vars_out).
       super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  puVar12 = (block->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 ==
      (block->inst).
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar13 = false;
  }
  else {
    this_01 = &block->inst;
    bVar13 = false;
    do {
      local_40 = &PTR_display_001ee058;
      local_38[0] = ((puVar12[-1]._M_t.
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
      pmVar7 = std::
               map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
               ::operator[](vartable,local_38);
      peVar1 = (pmVar7->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = (pmVar7->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      iVar6 = (*(peVar1->super_Displayable)._vptr_Displayable[1])();
      __position._M_current = puVar12 + -1;
      if (((iVar6 != 1) &&
          (iVar6 = (*((((__position._M_current)->_M_t).
                       super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                       .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                     super_Displayable)._vptr_Displayable[1])(), iVar6 != 4)) &&
         (iVar6 = (*((((__position._M_current)->_M_t).
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                    super_Displayable)._vptr_Displayable[1])(), iVar6 != 6)) {
        iVar6 = (int)((ulong)((long)puVar12 -
                             (long)(this_01->
                                   super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3);
        local_44 = iVar6 + -1;
        peVar2 = (blv->
                 super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        lVar3 = (long)(peVar2->instLiveVars).
                      super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(long)iVar6 <
            (ulong)((long)(peVar2->instLiveVars).
                          super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4)) {
          lVar3 = lVar3 + (long)local_44 * 0x10;
          __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x18);
          local_58 = *(element_type **)(lVar3 + 0x10);
        }
        else {
          local_58 = (peVar2->live_vars_out).
                     super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
          __r = &(peVar2->live_vars_out).
                 super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_50,__r);
        p_Var8 = &(local_58->_M_t)._M_impl.super__Rb_tree_header;
        p_Var10 = (local_58->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = &p_Var8->_M_header;
        for (; p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[bVar14]) {
          bVar14 = *(uint *)&p_Var10[1]._M_parent < local_38[0];
          if (!bVar14) {
            p_Var9 = p_Var10;
          }
        }
        p_Var10 = &p_Var8->_M_header;
        if (((_Rb_tree_header *)p_Var9 != p_Var8) &&
           (p_Var10 = p_Var9, local_38[0] < *(uint *)&p_Var9[1]._M_parent)) {
          p_Var10 = &p_Var8->_M_header;
        }
        if ((_Rb_tree_header *)p_Var10 == p_Var8) {
          __position = std::
                       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       ::_M_erase(this_01,__position);
          peVar2 = (blv->
                   super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          std::
          vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::_M_erase(&peVar2->instLiveVars,
                     (peVar2->instLiveVars).
                     super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_44);
          livevar_analyse::Block_Live_Var::update
                    ((blv->
                     super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr,iVar6 + -2);
          bVar13 = true;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      puVar12 = __position._M_current;
    } while (__position._M_current !=
             (this_01->
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::clear(&((((blv->
              super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->live_vars_in).
            super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_M_t);
  peVar2 = (blv->
           super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  psVar4 = (peVar2->instLiveVars).
           super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar11 = &peVar2->live_vars_out;
  if ((peVar2->instLiveVars).
      super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    psVar11 = psVar4;
  }
  peVar5 = (psVar11->
           super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  std::
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
            ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
              *)(peVar2->live_vars_in).
                super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,(peVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<mir::inst::VarId>)
             &(peVar5->_M_t)._M_impl.super__Rb_tree_header);
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  return bVar13;
}

Assistant:

bool remove_dead_code(std::shared_ptr<livevar_analyse::Block_Live_Var> blv,
                        mir::inst::BasicBlk& block,
                        std::map<uint32_t, mir::inst::Variable>& vartable) {
    bool modify = false;
    auto tmp = blv->live_vars_out;
    for (auto riter = block.inst.rbegin(); riter != block.inst.rend();) {
      auto defvar = riter->get()->dest;
      auto defvariable = vartable[defvar.id];
      if (defvariable.ty->kind() == mir::types::TyKind::Void ||
          riter->get()->inst_kind() == mir::inst::InstKind::Store ||
          riter->get()->inst_kind() == mir::inst::InstKind::Call) {
        riter++;
        continue;
      }
      int idx = block.inst.rend() - riter - 1;
      if (idx + 1 >= blv->instLiveVars.size()) {  // remove the last code
        tmp = blv->live_vars_out;
      } else {
        tmp = *(blv->instLiveVars.begin() + idx + 1);
      }
      if (!tmp->count(defvar)) {
        riter = std::vector<std::unique_ptr<mir::inst::Inst>>::reverse_iterator(
            block.inst.erase((++riter).base()));
        blv->instLiveVars.erase(blv->instLiveVars.begin() + idx);
        // vartable.erase(defvar.id);
        blv->update(idx - 1);
        modify = true;
      } else {
        riter++;
      }
    }
    // if (modify) {
    //   build(live_vars_out, block);
    // }
    blv->live_vars_in->clear();
    if (blv->instLiveVars.size()) {
      blv->live_vars_in->insert(blv->instLiveVars[0]->begin(),
                                blv->instLiveVars[0]->end());
    } else {  // Maybe the block's codes are all dead
      blv->live_vars_in->insert(blv->live_vars_out->begin(),
                                blv->live_vars_out->end());
    }
    return modify;
  }